

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O3

void wstran_listener_close(void *arg)

{
  void *item;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x20));
  if (*(char *)((long)arg + 0x239) == '\0') {
    *(undefined1 *)((long)arg + 0x239) = 1;
    nni_aio_close((nni_aio *)((long)arg + 0x48));
    for (item = nni_list_first((nni_list *)((long)arg + 0x220)); item != (void *)0x0;
        item = nni_list_next((nni_list *)((long)arg + 0x220),item)) {
      nni_pipe_close(*(nni_pipe **)((long)item + 0x3d8));
    }
    nng_stream_listener_close(*(nng_stream_listener **)((long)arg + 0x210));
  }
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x20));
  return;
}

Assistant:

static void
wstran_listener_close(void *arg)
{
	ws_listener *l = arg;
	ws_pipe     *p;

	nni_mtx_lock(&l->mtx);
	if (!l->closed) {
		l->closed = true;
		nni_aio_close(&l->accaio);
		NNI_LIST_FOREACH (&l->wait_pipes, p) {
			nni_pipe_close(p->npipe);
		}
		nng_stream_listener_close(l->listener);
	}
	nni_mtx_unlock(&l->mtx);
}